

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structured_bindings.cpp
# Opt level: O0

int main(void)

{
  initializer_list<double> __l;
  __tuple_element_t<0UL,_tuple<double,_vector<unsigned_long,_allocator<unsigned_long>_>_>_> *p_Var1;
  __tuple_element_t<1UL,_tuple<double,_vector<unsigned_long,_allocator<unsigned_long>_>_>_> *vector;
  ostream *poVar2;
  type *indices;
  type *median_value;
  tuple<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_a0;
  allocator<double> local_69;
  double local_68 [6];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> elements;
  
  elements.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_68[4] = 0.0;
  local_68[5] = 1.0;
  local_68[2] = -0.1;
  local_68[3] = -0.2;
  local_68[0] = 1.2;
  local_68[1] = 1.1;
  local_38 = local_68;
  local_30 = 6;
  std::allocator<double>::allocator(&local_69);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,__l,&local_69);
  std::allocator<double>::~allocator(&local_69);
  std::operator<<((ostream *)&std::cout,"elements=");
  printVector<double>((vector<double,_std::allocator<double>_> *)local_28);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  main::anon_class_1_0_00000001::operator()
            (&local_a0,(anon_class_1_0_00000001 *)((long)&median_value + 7),
             (vector<double,_std::allocator<double>_> *)local_28);
  p_Var1 = std::get<0ul,double,std::vector<unsigned_long,std::allocator<unsigned_long>>>(&local_a0);
  vector = std::get<1ul,double,std::vector<unsigned_long,std::allocator<unsigned_long>>>(&local_a0);
  poVar2 = std::operator<<((ostream *)&std::cout,"median_value=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*p_Var1);
  std::operator<<(poVar2," ");
  std::operator<<((ostream *)&std::cout,"indices=");
  printVector<unsigned_long>(vector);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  elements.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::tuple<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~tuple(&local_a0)
  ;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return elements.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
    // Let's create an vector of floats to run our algorithm on.
    const std::vector<double> elements {
        1.2, 1.1, -0.1, -0.2, 0, 1
        };

    {
        // Print out the values.
        std::cout << "elements=";
        printVector(elements);
        std::cout << std::endl;
    }

    // At this point we declare what we want - constant value variables
    // "median_value" and indices. They are returned from the lambda and
    // unpacked by means of a structured binding into separate variables
    // right in the current scope.
    // Please notice that we do not capture "elements" into lambda's
    // capture list. A reference (&) capture list enables non-const access
    // to the outer-scope "elements". If for some reason "elements" are
    // declared non-const, lambda's body may by mistake modify its contents.
    // Instead we pass elements as a const reference parameter.
    const auto [median_value, indices] = [](const std::vector<double>& elements)
    {
        // Inside the lambda we allow ourselves some non-functional style by
        // initializing the result variable with a default value which is
        // a tuple of NaN and an empty list to account for possible
        // empty input list.
        auto result = std::make_tuple(
            std::numeric_limits<double>::quiet_NaN(),
            std::vector<size_t>());

        auto size = elements.size();

        if (size > 0)
        {
            // To keep track of the indices which were used to calculate
            // a median, we enumerate elements much alike in python.
            std::vector<std::pair<size_t, double> > enumeratedElements;
            for (size_t index = 0; index < elements.size(); ++index)
            {
                enumeratedElements.emplace_back(index, elements[index]);
            }

            // Now we are all set to sort the elements by values which
            // are stored in "second" field of a tuple.
            std::sort(enumeratedElements.begin(), enumeratedElements.end(),
                [](auto a, auto b){ return a.second > b.second; });

            // A median is calculated out of a middle element of odd-sized
            // lists and out of the two middle elements of an even-sized list.
            std::vector<size_t> indices = (size % 2 == 0) ?
                std::vector<size_t>{size / 2 - 1, size / 2} :
                std::vector<size_t>{size / 2};

            // Let's disentangle indices and values back from the tuples
            // that we are interested in.
            std::vector<size_t> originalIndices;
            std::vector<double> values;
            for (const auto& index : indices)
            {
                originalIndices.push_back(enumeratedElements[index].first);
                values.push_back(enumeratedElements[index].second);
            }

            // Here we stick to the functional paradigm again to mean-reduce
            // one or two values of interest.
            auto median = std::accumulate(values.begin(), values.end(), 0.0) /
                values.size();

            // And return a tuple to be unpacked with a structured binding.
            result = std::make_tuple(median, originalIndices);
        }
        return result;
    }(elements); // Our lambda is one-time use, so just call it.

    // ....... long code here .........

    // By mistake we try to reuse short variable names,
    // but therefore overwrite the original values

    // median_value = 12.3; // Does not compile
    // indices = std::vector<size_t>{100, 200}; // Does not compile

    // Voila! Our fancy const structured bindings save us from a bug,
    // and this happens at compile stage, not after a couple of hours
    // of debugging.

    // ....... more code here .........

    // At some point we again need the original "median_value" or "indices".
    // It is safe to assume that the values are never corrupted
    // thanks to the const qualifier.

    {
        // Print out the results.
        std::cout << "median_value=" << median_value << " ";
        std::cout << "indices=";
        printVector(indices);
        std::cout << std::endl;
    }

    return 0;
}